

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

float Gia_ManDelayTraceLutPrint(Gia_Man_t *p,int fVerbose)

{
  void *pvVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  void *__ptr;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  Vec_Flt_t *__ptr_00;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pvVar1 = p->pLutLib;
  if (pvVar1 == (void *)0x0) {
    iVar6 = Gia_ManLutLevel(p,(int **)0x0);
    fVar13 = (float)iVar6;
  }
  else {
    iVar6 = *(int *)((long)pvVar1 + 8);
    iVar4 = Gia_ManLutSizeMax(p);
    if (iVar6 < iVar4) {
      uVar8 = *(uint *)((long)pvVar1 + 8);
      uVar5 = Gia_ManLutSizeMax(p);
      printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar8,
             (ulong)uVar5);
      return -1e+09;
    }
    fVar13 = 20.0;
  }
  fVar12 = (fVar13 + 1.0) * 4.0;
  uVar7 = (ulong)fVar12;
  uVar11 = 1;
  __ptr = calloc(1,(long)(fVar12 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7);
  fVar12 = Gia_ManDelayTraceLut(p);
  iVar6 = p->nObjs;
  if (1 < (long)iVar6) {
    pVVar2 = p->vMapping;
    uVar8 = pVVar2->nSize;
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    lVar10 = 5;
    do {
      if (uVar7 == uVar11) {
LAB_00768a3a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = pVVar2->pArray;
      uVar5 = piVar3[uVar11];
      if ((ulong)uVar5 != 0) {
        if (((int)uVar5 < 0) || (uVar8 <= uVar5)) goto LAB_00768a3a;
        if (piVar3[uVar5] != 0) {
          if (p->vTiming->nSize <= (int)lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          fVar14 = p->vTiming->pArray[lVar10] / (fVar12 / fVar13);
          if (fVar14 <= fVar13) {
            if ((fVar14 < 0.0) || (fVar13 < fVar14)) {
              __assert_fail("Num >=0 && Num <= nSteps",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSpeedup.c"
                            ,0x1d6,"float Gia_ManDelayTraceLutPrint(Gia_Man_t *, int)");
            }
            piVar3 = (int *)((long)__ptr + (long)(int)fVar14 * 4);
            *piVar3 = *piVar3 + 1;
          }
        }
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 3;
    } while ((long)iVar6 != uVar11);
  }
  if (fVerbose == 0) {
LAB_007689c7:
    if (__ptr == (void *)0x0) goto LAB_007689d9;
  }
  else {
    pcVar9 = "LUT library";
    if (pvVar1 == (void *)0x0) {
      pcVar9 = "unit-delay";
    }
    printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar12,pcVar9);
    if (fVar13 <= 0.0) goto LAB_007689c7;
    pcVar9 = "%";
    if (pvVar1 == (void *)0x0) {
      pcVar9 = "lev";
    }
    uVar7 = 0;
    uVar5 = 5;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + *(int *)((long)__ptr + uVar7 * 4);
      uVar7 = uVar7 + 1;
      uVar11 = (ulong)uVar5;
      if (pvVar1 == (void *)0x0) {
        uVar11 = uVar7 & 0xffffffff;
      }
      iVar6 = Gia_ManLutNum(p);
      printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)uVar8 * 100.0) / (double)iVar6,uVar11,pcVar9
             ,(ulong)uVar8);
      uVar5 = uVar5 + 5;
    } while ((float)(int)uVar7 < fVar13);
  }
  free(__ptr);
LAB_007689d9:
  __ptr_00 = p->vTiming;
  if (__ptr_00 == (Vec_Flt_t *)0x0) {
    __assert_fail("p->vTiming != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x243,"void Gia_ManTimeStop(Gia_Man_t *)");
  }
  if (__ptr_00->pArray != (float *)0x0) {
    free(__ptr_00->pArray);
    p->vTiming->pArray = (float *)0x0;
    __ptr_00 = p->vTiming;
    if (__ptr_00 == (Vec_Flt_t *)0x0) {
      return fVar12;
    }
  }
  free(__ptr_00);
  p->vTiming = (Vec_Flt_t *)0x0;
  return fVar12;
}

Assistant:

float Gia_ManDelayTraceLutPrint( Gia_Man_t * p, int fVerbose )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    if ( pLutLib && pLutLib->LutMax < Gia_ManLutSizeMax(p) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Gia_ManLutSizeMax(p) );
        return -ABC_INFINITY;
    }
    // decide how many steps
    nSteps = pLutLib ? 20 : Gia_ManLutLevel(p, NULL);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Gia_ManDelayTraceLut( p );
    tDelta   = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutSize(p, i) == 0 )
            continue;
        Num = Gia_ObjTimeSlack(p, i) / tDelta;
        if ( Num > nSteps )
            continue;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results    
    if ( fVerbose )
    {
        printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, pLutLib? "LUT library" : "unit-delay" );
        Nodes = 0;
        for ( i = 0; i < nSteps; i++ )
        {
            Nodes += pCounters[i];
            printf( "%3d %s : %5d  (%6.2f %%)\n", pLutLib? 5*(i+1) : i+1, 
                pLutLib? "%":"lev", Nodes, 100.0*Nodes/Gia_ManLutNum(p) );
        }
    }
    ABC_FREE( pCounters );
    Gia_ManTimeStop( p );
    return tArrival;
}